

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec3.h
# Opt level: O0

vec3 * random_unit_vector(void)

{
  vec3 *in_RDI;
  double dVar1;
  double lensq;
  vec3 p;
  
  do {
    do {
      vec3::random();
      dVar1 = vec3::length_squared((vec3 *)&lensq);
    } while (dVar1 <= 1e-160);
  } while (1.0 < dVar1);
  dVar1 = sqrt(dVar1);
  operator/(in_RDI,(vec3 *)&lensq,dVar1);
  return in_RDI;
}

Assistant:

inline vec3 random_unit_vector() {
    while (true) {
        auto p = vec3::random(-1,1);
        auto lensq = p.length_squared();
        if (1e-160 < lensq && lensq <= 1.0)
            return p / sqrt(lensq);
    }
}